

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

uchar * sqlite3_serialize(sqlite3 *db,char *zSchema,sqlite3_int64 *piSize,uint mFlags)

{
  MemStore *pMVar1;
  Btree *pBVar2;
  Pager *pPVar3;
  size_t __n;
  uint uVar4;
  int iVar5;
  MemFile *pMVar6;
  void *__dest;
  uchar *puVar7;
  char *zSql;
  sqlite3_int64 sVar8;
  DbPage *pPg;
  ulong uVar9;
  uchar *__dest_00;
  sqlite3_stmt *pStmt_00;
  DbPage *pPage;
  size_t local_50;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_40;
  ulong local_38;
  
  pStmt = (sqlite3_stmt *)0x0;
  if (zSchema == (char *)0x0) {
    zSchema = db->aDb->zDbSName;
  }
  pMVar6 = memdbFromDbSchema(db,zSchema);
  uVar4 = sqlite3FindDbName(db,zSchema);
  if (piSize != (sqlite3_int64 *)0x0) {
    *piSize = -1;
  }
  if ((int)uVar4 < 0) {
    return (uchar *)0x0;
  }
  if (pMVar6 != (MemFile *)0x0) {
    pMVar1 = pMVar6->pStore;
    if (piSize != (sqlite3_int64 *)0x0) {
      *piSize = pMVar1->sz;
    }
    if ((mFlags & 1) == 0) {
      __dest = sqlite3_malloc64(pMVar1->sz);
      if (__dest == (void *)0x0) {
        return (uchar *)0x0;
      }
      puVar7 = (uchar *)memcpy(__dest,pMVar1->aData,pMVar1->sz);
      return puVar7;
    }
    return pMVar1->aData;
  }
  pBVar2 = db->aDb[uVar4].pBt;
  if (pBVar2 == (Btree *)0x0) {
    return (uchar *)0x0;
  }
  local_50 = (size_t)(int)pBVar2->pBt->pageSize;
  zSql = sqlite3_mprintf("PRAGMA \"%w\".page_count",zSchema);
  if (zSql == (char *)0x0) {
    sqlite3_free((void *)0x0);
    return (uchar *)0x0;
  }
  iVar5 = sqlite3_prepare_v2(db,zSql,-1,&pStmt,(char **)0x0);
  sqlite3_free(zSql);
  pStmt_00 = pStmt;
  if (iVar5 != 0) {
    return (uchar *)0x0;
  }
  iVar5 = sqlite3_step(pStmt);
  if (iVar5 == 100) {
    sVar8 = sqlite3_column_int64(pStmt_00,0);
    if (piSize != (sqlite3_int64 *)0x0) {
      *piSize = sVar8 * local_50;
    }
    if ((mFlags & 1) == 0) {
      puVar7 = (uchar *)sqlite3_malloc64(sVar8 * local_50);
      uVar9 = 0;
      if (puVar7 != (uchar *)0x0) {
        local_40 = pStmt_00;
        uVar4 = sqlite3_column_int(pStmt_00,0);
        __n = local_50;
        pPVar3 = pBVar2->pBt->pPager;
        __dest_00 = puVar7;
        local_38 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          local_38 = uVar9;
        }
        for (; pStmt_00 = local_40, local_38 != uVar9; uVar9 = uVar9 + 1) {
          pPage = (DbPage *)0x0;
          iVar5 = (*pPVar3->xGet)(pPVar3,(int)uVar9 + 1,&pPage,0);
          pPg = pPage;
          if (iVar5 == 0) {
            memcpy(__dest_00,pPage->pData,__n);
          }
          else {
            memset(__dest_00,0,__n);
            pPg = pPage;
          }
          sqlite3PagerUnref(pPg);
          __dest_00 = __dest_00 + __n;
        }
        goto LAB_001220cb;
      }
    }
  }
  puVar7 = (uchar *)0x0;
LAB_001220cb:
  sqlite3_finalize(pStmt_00);
  return puVar7;
}

Assistant:

SQLITE_API unsigned char *sqlite3_serialize(
  sqlite3 *db,              /* The database connection */
  const char *zSchema,      /* Which database within the connection */
  sqlite3_int64 *piSize,    /* Write size here, if not NULL */
  unsigned int mFlags       /* Maybe SQLITE_SERIALIZE_NOCOPY */
){
  MemFile *p;
  int iDb;
  Btree *pBt;
  sqlite3_int64 sz;
  int szPage = 0;
  sqlite3_stmt *pStmt = 0;
  unsigned char *pOut;
  char *zSql;
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  if( zSchema==0 ) zSchema = db->aDb[0].zDbSName;
  p = memdbFromDbSchema(db, zSchema);
  iDb = sqlite3FindDbName(db, zSchema);
  if( piSize ) *piSize = -1;
  if( iDb<0 ) return 0;
  if( p ){
    MemStore *pStore = p->pStore;
    assert( pStore->pMutex==0 );
    if( piSize ) *piSize = pStore->sz;
    if( mFlags & SQLITE_SERIALIZE_NOCOPY ){
      pOut = pStore->aData;
    }else{
      pOut = sqlite3_malloc64( pStore->sz );
      if( pOut ) memcpy(pOut, pStore->aData, pStore->sz);
    }
    return pOut;
  }
  pBt = db->aDb[iDb].pBt;
  if( pBt==0 ) return 0;
  szPage = sqlite3BtreeGetPageSize(pBt);
  zSql = sqlite3_mprintf("PRAGMA \"%w\".page_count", zSchema);
  rc = zSql ? sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0) : SQLITE_NOMEM;
  sqlite3_free(zSql);
  if( rc ) return 0;
  rc = sqlite3_step(pStmt);
  if( rc!=SQLITE_ROW ){
    pOut = 0;
  }else{
    sz = sqlite3_column_int64(pStmt, 0)*szPage;
    if( piSize ) *piSize = sz;
    if( mFlags & SQLITE_SERIALIZE_NOCOPY ){
      pOut = 0;
    }else{
      pOut = sqlite3_malloc64( sz );
      if( pOut ){
        int nPage = sqlite3_column_int(pStmt, 0);
        Pager *pPager = sqlite3BtreePager(pBt);
        int pgno;
        for(pgno=1; pgno<=nPage; pgno++){
          DbPage *pPage = 0;
          unsigned char *pTo = pOut + szPage*(sqlite3_int64)(pgno-1);
          rc = sqlite3PagerGet(pPager, pgno, (DbPage**)&pPage, 0);
          if( rc==SQLITE_OK ){
            memcpy(pTo, sqlite3PagerGetData(pPage), szPage);
          }else{
            memset(pTo, 0, szPage);
          }
          sqlite3PagerUnref(pPage);
        }
      }
    }
  }
  sqlite3_finalize(pStmt);
  return pOut;
}